

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O0

gkc_tuple * gkc_alloc(gkc_summary *s)

{
  void *ret;
  gkc_summary *s_local;
  
  s->alloced = s->alloced + 1;
  if (s->max_alloced < s->alloced) {
    s->max_alloced = s->alloced;
  }
  if (s->fl == (freelist *)0x0) {
    s_local = (gkc_summary *)malloc(0x28);
  }
  else {
    s_local = (gkc_summary *)s->fl;
    s->fl = s->fl->next;
  }
  return (gkc_tuple *)s_local;
}

Assistant:

static struct gkc_tuple *gkc_alloc(struct gkc_summary *s)
{
    s->alloced++;
    if (s->alloced > s->max_alloced) {
        s->max_alloced = s->alloced;
    }

    if (s->fl) {
        void *ret;
        ret = s->fl;
        s->fl = s->fl->next;
        return ret;
    }
    return malloc(sizeof(struct gkc_tuple));
}